

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void av1_highbd_inv_txfm_add_avx2(tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  uint uVar1;
  int32_t *in_RCX;
  undefined4 in_EDX;
  tran_low_t *in_RSI;
  TX_SIZE tx_size;
  int in_stack_ffffffffffffffcc;
  TX_SIZE in_stack_ffffffffffffffd2;
  TX_TYPE in_stack_ffffffffffffffd3;
  int in_stack_ffffffffffffffd4;
  undefined3 in_stack_ffffffffffffffdc;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar2 = CONCAT13(*(byte *)((long)in_RCX + 1),in_stack_ffffffffffffffdc);
  uVar1 = (uint)*(byte *)((long)in_RCX + 1);
  if (((uVar1 == 0) || (uVar1 - 5 < 2)) || (uVar1 == 0xd || uVar1 == 0xe)) {
    av1_highbd_inv_txfm_add_sse4_1
              (in_RSI,(uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
               (int)((ulong)in_RCX >> 0x20),(TxfmParam *)CONCAT44(uVar2,uVar1));
  }
  else {
    av1_highbd_inv_txfm2d_add_universe_avx2
              (in_RCX,(uint8_t *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffd4,
               in_stack_ffffffffffffffd3,in_stack_ffffffffffffffd2,in_stack_ffffffffffffffcc,
               (int)in_RSI);
  }
  return;
}

Assistant:

void av1_highbd_inv_txfm_add_avx2(const tran_low_t *input, uint8_t *dest,
                                  int stride, const TxfmParam *txfm_param) {
  assert(av1_ext_tx_used[txfm_param->tx_set_type][txfm_param->tx_type]);
  const TX_SIZE tx_size = txfm_param->tx_size;
  switch (tx_size) {
    case TX_4X8:
    case TX_8X4:
    case TX_4X4:
    case TX_16X4:
    case TX_4X16:
      av1_highbd_inv_txfm_add_sse4_1(input, dest, stride, txfm_param);
      break;
    default:
      av1_highbd_inv_txfm2d_add_universe_avx2(
          input, dest, stride, txfm_param->tx_type, txfm_param->tx_size,
          txfm_param->eob, txfm_param->bd);
      break;
  }
}